

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32 field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  Limit limit;
  int iVar5;
  uint32 first_byte_or_zero;
  int64 iVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  int value;
  ulong unaff_R14;
  bool bVar10;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    uVar9 = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      bVar10 = true;
      goto LAB_0033ba63;
    }
  }
  else {
    uVar9 = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
  uVar9 = (uint)iVar6;
  bVar10 = -1 < iVar6;
LAB_0033ba63:
  if (bVar10) {
    limit = io::CodedInputStream::PushLimit(input,uVar9);
    do {
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar5 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0033baaf;
        input->buffer_ = pbVar2 + 1;
        bVar10 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_0033baaf:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar10 = -1 < (long)uVar7;
      }
      uVar3 = unaff_R14;
      if (bVar10) {
        uVar3 = uVar7;
      }
      unaff_R14 = uVar3 & 0xffffffff;
      if (!bVar10) {
        return false;
      }
      iVar5 = (int)uVar3;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar4 = (*is_valid)(iVar5), bVar4)) {
        uVar9 = values->current_size_;
        if (uVar9 == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        piVar8 = RepeatedField<int>::elements(values);
        piVar8[uVar9] = iVar5;
        values->current_size_ = uVar9 + 1;
      }
      else {
        UnknownFieldSet::AddVarint(unknown_fields,field_number,(long)iVar5);
      }
    } while (bVar10);
  }
  return false;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32 field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}